

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O1

void incdec_verify::PreIncTestInt64(void)

{
  bool expected;
  long t;
  code *pcVar1;
  long lVar2;
  string local_50;
  
  lVar2 = 0x10;
  while( true ) {
    t = *(long *)(&UNK_0014d7a0 + lVar2);
    if (t == 0x7fffffffffffffff) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (SCARRY8(t,1)) break;
    expected = *(bool *)((long)&inc_int64 + lVar2);
    if ((t + 1 == *(long *)(&UNK_0014d7a8 + lVar2)) != expected) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case inc_int64 throw (1): ","");
      err_msg<long>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0x1a8) {
      return;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void PreIncTestInt64()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int64_t > si(inc_int64[i].x);
			SafeInt< std::int64_t > vv = ++si;

			if(vv != inc_int64[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int64[i].fExpected )
		{
			err_msg( "Error in case inc_int64 throw (1): ", inc_int64[i].x, inc_int64[i].fExpected );
		}
	}
}